

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
linkedList<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
          (Earcut<unsigned_int> *this,
          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *points,
          bool clockwise)

{
  bool bVar1;
  size_type sVar2;
  byte in_DL;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *in_RSI;
  Earcut<unsigned_int> *in_RDI;
  type tVar3;
  type tVar4;
  double p21;
  double p11;
  double p10;
  double p20;
  value_type *p2;
  value_type *p1;
  Node *last;
  size_t j;
  size_t i;
  size_t len;
  double sum;
  size_type local_80;
  array<float,_2UL> *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  Earcut<unsigned_int> *in_stack_ffffffffffffffa0;
  Node *local_40;
  size_type local_38;
  ulong local_30;
  double local_20;
  
  local_20 = 0.0;
  sVar2 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::size
                    (in_RSI);
  local_40 = (Node *)0x0;
  local_30 = 0;
  if (sVar2 == 0) {
    local_80 = 0;
  }
  else {
    local_80 = sVar2 - 1;
  }
  local_38 = local_80;
  for (; local_30 < sVar2; local_30 = local_30 + 1) {
    std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
              (in_RSI,local_30);
    std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
              (in_RSI,local_38);
    tVar3 = util::nth<0UL,_std::array<float,_2UL>_>::get((array<float,_2UL> *)0x19914f);
    tVar4 = util::nth<0UL,_std::array<float,_2UL>_>::get((array<float,_2UL> *)0x199163);
    in_stack_ffffffffffffffa0 = (Earcut<unsigned_int> *)(double)tVar4;
    tVar4 = util::nth<1UL,_std::array<float,_2UL>_>::get((array<float,_2UL> *)0x199177);
    in_stack_ffffffffffffff98 = (double)tVar4;
    tVar4 = util::nth<1UL,_std::array<float,_2UL>_>::get((array<float,_2UL> *)0x19918b);
    in_stack_ffffffffffffff90 = (array<float,_2UL> *)(double)tVar4;
    local_20 = ((double)tVar3 - (double)in_stack_ffffffffffffffa0) *
               (in_stack_ffffffffffffff98 + (double)in_stack_ffffffffffffff90) + local_20;
    local_38 = local_30;
  }
  local_30 = sVar2;
  if ((bool)(in_DL & 1) == 0.0 < local_20) {
    for (local_30 = 0; local_30 < sVar2; local_30 = local_30 + 1) {
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (in_RSI,local_30);
      local_40 = insertNode<std::array<float,2ul>>
                           (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90,(Node *)in_RDI);
    }
  }
  else {
    while (local_30 != 0) {
      std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::operator[]
                (in_RSI,local_30 - 1);
      local_40 = insertNode<std::array<float,2ul>>
                           (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90,(Node *)in_RDI);
      local_30 = local_30 - 1;
    }
  }
  if ((local_40 != (Node *)0x0) && (bVar1 = equals(in_RDI,local_40,local_40->next), bVar1)) {
    removeNode(in_RDI,local_40);
    local_40 = local_40->next;
  }
  in_RDI->vertices = sVar2 + in_RDI->vertices;
  return local_40;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}